

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch_finit.c
# Opt level: O0

void mpt_dispatch_fini(mpt_dispatch *disp)

{
  mpt_metatype *pmVar1;
  mpt_metatype *ctx;
  mpt_dispatch *disp_local;
  
  disp->_def = 0;
  mpt_command_clear(&disp->_d);
  mpt_array_clone(&disp->_d,(mpt_array *)0x0);
  if ((disp->_err).cmd != (mpt_event_handler_t)0x0) {
    (*(disp->_err).cmd)((disp->_err).arg,(mpt_event *)0x0);
    (disp->_err).cmd = (mpt_event_handler_t)0x0;
    (disp->_err).arg = (void *)0x0;
  }
  pmVar1 = disp->_ctx;
  if (pmVar1 != (mpt_metatype *)0x0) {
    (*pmVar1->_vptr->unref)(pmVar1);
    disp->_ctx = (mpt_metatype *)0x0;
  }
  return;
}

Assistant:

extern void mpt_dispatch_fini(MPT_STRUCT(dispatch) *disp)
{
	MPT_STRUCT(metatype) *ctx;
	
	/* dereference registered commands */
	disp->_def  = 0;
	mpt_command_clear(&disp->_d);
	mpt_array_clone(&disp->_d, 0);
	
	if (disp->_err.cmd) {
		disp->_err.cmd(disp->_err.arg, 0);
		disp->_err.cmd = 0;
		disp->_err.arg = 0;
	}
	if ((ctx = disp->_ctx)) {
		ctx->_vptr->unref(ctx);
		disp->_ctx = 0;
	}
}